

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O0

CURLcode transfer_per_config(GlobalConfig *global,OperationConfig *config,CURLSH *share,_Bool *added
                            )

{
  char *pcVar1;
  char *local_50;
  char *env;
  curl_tlssessioninfo *tls_backend_info;
  CURL *curltls;
  _Bool capath_from_env;
  _Bool *p_Stack_30;
  CURLcode result;
  _Bool *added_local;
  CURLSH *share_local;
  OperationConfig *config_local;
  GlobalConfig *global_local;
  
  curltls._4_4_ = CURLE_OK;
  *added = false;
  p_Stack_30 = added;
  added_local = (_Bool *)share;
  share_local = (CURLSH *)config;
  config_local = (OperationConfig *)global;
  if ((config->url_list == (getout *)0x0) || (config->url_list->url == (char *)0x0)) {
    helpf(global->errors,"no URL specified!\n");
    global_local._4_4_ = CURLE_FAILED_INIT;
  }
  else {
    curltls._3_1_ = 0;
    if (((config->cacert == (char *)0x0) && (config->capath == (char *)0x0)) &&
       ((config->insecure_ok & 1U) == 0)) {
      tls_backend_info = (curl_tlssessioninfo *)curl_easy_init();
      env = (char *)0x0;
      curltls._4_4_ = curl_easy_getinfo(tls_backend_info,0x40002d,&env);
      if (curltls._4_4_ != CURLE_OK) {
        return curltls._4_4_;
      }
      if (*(int *)env != 8) {
        local_50 = (char *)curl_getenv("CURL_CA_BUNDLE");
        if (local_50 == (char *)0x0) {
          local_50 = (char *)curl_getenv("SSL_CERT_DIR");
          if (local_50 == (char *)0x0) {
            local_50 = (char *)curl_getenv("SSL_CERT_FILE");
            if (local_50 != (char *)0x0) {
              pcVar1 = strdup(local_50);
              *(char **)(share_local + 0x240) = pcVar1;
              if (*(long *)(share_local + 0x240) == 0) {
                curl_free(local_50);
                errorf((GlobalConfig *)config_local,"out of memory\n");
                return CURLE_OUT_OF_MEMORY;
              }
            }
          }
          else {
            pcVar1 = strdup(local_50);
            *(char **)(share_local + 0x250) = pcVar1;
            if (*(long *)(share_local + 0x250) == 0) {
              curl_free(local_50);
              helpf((FILE *)config_local->random_file,"out of memory\n");
              return CURLE_OUT_OF_MEMORY;
            }
            curltls._3_1_ = 1;
          }
        }
        else {
          pcVar1 = strdup(local_50);
          *(char **)(share_local + 0x240) = pcVar1;
          if (*(long *)(share_local + 0x240) == 0) {
            curl_free(local_50);
            errorf((GlobalConfig *)config_local,"out of memory\n");
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if (local_50 != (char *)0x0) {
          curl_free(local_50);
        }
      }
      curl_easy_cleanup(tls_backend_info);
    }
    if (curltls._4_4_ == CURLE_OK) {
      curltls._4_4_ =
           single_transfer((GlobalConfig *)config_local,(OperationConfig *)share_local,
                           (CURLSH *)added_local,(_Bool)(curltls._3_1_ & 1),p_Stack_30);
    }
    global_local._4_4_ = curltls._4_4_;
  }
  return global_local._4_4_;
}

Assistant:

static CURLcode transfer_per_config(struct GlobalConfig *global,
                                    struct OperationConfig *config,
                                    CURLSH *share,
                                    bool *added)
{
  CURLcode result = CURLE_OK;
  bool capath_from_env;
  *added = FALSE;

  /* Check we have a url */
  if(!config->url_list || !config->url_list->url) {
    helpf(global->errors, "no URL specified!\n");
    return CURLE_FAILED_INIT;
  }

  /* On WIN32 we can't set the path to curl-ca-bundle.crt
   * at compile time. So we look here for the file in two ways:
   * 1: look at the environment variable CURL_CA_BUNDLE for a path
   * 2: if #1 isn't found, use the windows API function SearchPath()
   *    to find it along the app's path (includes app's dir and CWD)
   *
   * We support the environment variable thing for non-Windows platforms
   * too. Just for the sake of it.
   */
  capath_from_env = false;
  if(!config->cacert &&
     !config->capath &&
     !config->insecure_ok) {
    CURL *curltls = curl_easy_init();
    struct curl_tlssessioninfo *tls_backend_info = NULL;

    /* With the addition of CAINFO support for Schannel, this search could find
     * a certificate bundle that was previously ignored. To maintain backward
     * compatibility, only perform this search if not using Schannel.
     */
    result = curl_easy_getinfo(curltls, CURLINFO_TLS_SSL_PTR,
                               &tls_backend_info);
    if(result)
      return result;

    /* Set the CA cert locations specified in the environment. For Windows if
     * no environment-specified filename is found then check for CA bundle
     * default filename curl-ca-bundle.crt in the user's PATH.
     *
     * If Schannel is the selected SSL backend then these locations are
     * ignored. We allow setting CA location for schannel only when explicitly
     * specified by the user via CURLOPT_CAINFO / --cacert.
     */
    if(tls_backend_info->backend != CURLSSLBACKEND_SCHANNEL) {
      char *env;
      env = curlx_getenv("CURL_CA_BUNDLE");
      if(env) {
        config->cacert = strdup(env);
        if(!config->cacert) {
          curl_free(env);
          errorf(global, "out of memory\n");
          return CURLE_OUT_OF_MEMORY;
        }
      }
      else {
        env = curlx_getenv("SSL_CERT_DIR");
        if(env) {
          config->capath = strdup(env);
          if(!config->capath) {
            curl_free(env);
            helpf(global->errors, "out of memory\n");
            return CURLE_OUT_OF_MEMORY;
          }
          capath_from_env = true;
        }
        else {
          env = curlx_getenv("SSL_CERT_FILE");
          if(env) {
            config->cacert = strdup(env);
            if(!config->cacert) {
              curl_free(env);
              errorf(global, "out of memory\n");
              return CURLE_OUT_OF_MEMORY;
            }
          }
        }
      }

      if(env)
        curl_free(env);
#ifdef WIN32
      else {
        result = FindWin32CACert(config, tls_backend_info->backend,
                                 TEXT("curl-ca-bundle.crt"));
      }
#endif
    }
    curl_easy_cleanup(curltls);
  }

  if(!result)
    result = single_transfer(global, config, share, capath_from_env, added);

  return result;
}